

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall ImVector<ImDrawCmd>::push_front(ImVector<ImDrawCmd> *this,ImDrawCmd *v)

{
  int *piVar1;
  ImDrawCmd *pIVar2;
  ImTextureID pvVar3;
  ImDrawCallback p_Var4;
  undefined4 uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  uint uVar11;
  ImDrawCmd *pIVar12;
  long lVar13;
  int iVar14;
  
  uVar11 = this->Size;
  if (uVar11 == 0) {
    if (this->Capacity == 0) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar12 = (ImDrawCmd *)(*GImAllocatorAllocFunc)(0x1c0,GImAllocatorUserData);
      if (this->Data != (ImDrawCmd *)0x0) {
        memcpy(pIVar12,this->Data,(long)this->Size * 0x38);
        pIVar2 = this->Data;
        if ((pIVar2 != (ImDrawCmd *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
      }
      this->Data = pIVar12;
      this->Capacity = 8;
      lVar13 = (long)this->Size;
    }
    else {
      pIVar12 = this->Data;
      lVar13 = 0;
    }
    pIVar12 = pIVar12 + lVar13;
  }
  else {
    if (uVar11 == this->Capacity) {
      iVar14 = (int)uVar11 / 2 + uVar11;
      if (iVar14 <= (int)(uVar11 + 1)) {
        iVar14 = uVar11 + 1;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar12 = (ImDrawCmd *)(*GImAllocatorAllocFunc)((long)iVar14 * 0x38,GImAllocatorUserData);
      if (this->Data != (ImDrawCmd *)0x0) {
        memcpy(pIVar12,this->Data,(long)this->Size * 0x38);
        pIVar2 = this->Data;
        if ((pIVar2 != (ImDrawCmd *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
      }
      this->Data = pIVar12;
      this->Capacity = iVar14;
      uVar11 = this->Size;
    }
    else {
      pIVar12 = this->Data;
    }
    if (0 < (int)uVar11) {
      memmove(pIVar12 + 1,pIVar12,(ulong)uVar11 * 0x38);
      pIVar12 = this->Data;
    }
  }
  pIVar12->UserCallbackData = v->UserCallbackData;
  fVar7 = (v->ClipRect).x;
  fVar8 = (v->ClipRect).y;
  fVar9 = (v->ClipRect).z;
  fVar10 = (v->ClipRect).w;
  pvVar3 = v->TextureId;
  uVar11 = v->VtxOffset;
  uVar6 = v->IdxOffset;
  uVar5 = *(undefined4 *)&v->field_0x24;
  p_Var4 = v->UserCallback;
  pIVar12->ElemCount = v->ElemCount;
  *(undefined4 *)&pIVar12->field_0x24 = uVar5;
  pIVar12->UserCallback = p_Var4;
  pIVar12->TextureId = pvVar3;
  pIVar12->VtxOffset = uVar11;
  pIVar12->IdxOffset = uVar6;
  (pIVar12->ClipRect).x = fVar7;
  (pIVar12->ClipRect).y = fVar8;
  (pIVar12->ClipRect).z = fVar9;
  (pIVar12->ClipRect).w = fVar10;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_front(const T& v)              { if (Size == 0) push_back(v); else insert(Data, v); }